

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::clear
          (InnerMap *this)

{
  void **ppvVar1;
  MapKey *pMVar2;
  Arena *pAVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  ulong uVar6;
  const_iterator __position;
  Tree *tree;
  MapKey *this_00;
  
  if (this->num_buckets_ == 0) {
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    do {
      ppvVar1 = this->table_;
      this_00 = (MapKey *)ppvVar1[uVar6];
      if (this_00 != (MapKey *)0x0) {
        if (this_00 == (MapKey *)ppvVar1[uVar6 ^ 1]) {
          uVar5 = uVar6 + 1;
          ppvVar1[uVar6 + 1] = (void *)0x0;
          this->table_[uVar6] = (void *)0x0;
          __position._M_node = (_Base_ptr)this_00[2].val_.string_value_;
          do {
            pMVar2 = *(MapKey **)(__position._M_node + 1);
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
            std::
            _Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
            ::_M_erase_aux((_Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                            *)this_00,__position);
            MapKey::~MapKey(pMVar2);
            if ((this->alloc_).arena_ == (Arena *)0x0) {
              operator_delete(pMVar2);
            }
            __position._M_node = p_Var4;
          } while (p_Var4 != (_Base_ptr)(this_00 + 1));
          pAVar3 = (this->alloc_).arena_;
          std::
          _Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
          ::~_Rb_tree((_Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                       *)this_00);
          uVar6 = uVar5;
          if (pAVar3 == (Arena *)0x0) {
            operator_delete(this_00);
          }
        }
        else {
          ppvVar1[uVar6] = (void *)0x0;
          do {
            pMVar2 = *(MapKey **)&this_00[1].type_;
            MapKey::~MapKey(this_00);
            if ((this->alloc_).arena_ == (Arena *)0x0) {
              operator_delete(this_00);
            }
            this_00 = pMVar2;
          } while (pMVar2 != (MapKey *)0x0);
        }
      }
      uVar6 = uVar6 + 1;
      uVar5 = this->num_buckets_;
    } while (uVar6 < uVar5);
  }
  this->num_elements_ = 0;
  this->index_of_first_non_null_ = uVar5;
  return;
}

Assistant:

void clear() {
      for (size_type b = 0; b < num_buckets_; b++) {
        if (TableEntryIsNonEmptyList(b)) {
          Node* node = static_cast<Node*>(table_[b]);
          table_[b] = NULL;
          do {
            Node* next = node->next;
            DestroyNode(node);
            node = next;
          } while (node != NULL);
        } else if (TableEntryIsTree(b)) {
          Tree* tree = static_cast<Tree*>(table_[b]);
          GOOGLE_DCHECK(table_[b] == table_[b + 1] && (b & 1) == 0);
          table_[b] = table_[b + 1] = NULL;
          typename Tree::iterator tree_it = tree->begin();
          do {
            Node* node = NodePtrFromKeyPtr(*tree_it);
            typename Tree::iterator next = tree_it;
            ++next;
            tree->erase(tree_it);
            DestroyNode(node);
            tree_it = next;
          } while (tree_it != tree->end());
          DestroyTree(tree);
          b++;
        }
      }
      num_elements_ = 0;
      index_of_first_non_null_ = num_buckets_;
    }